

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::
Animatable<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::get
          (Animatable<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
           *this,double t,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *v,
          TimeSampleInterpolationType tinerp)

{
  bool bVar1;
  
  if ((v == (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)0x0) ||
     (this->_blocked != false)) {
LAB_00577ff3:
    bVar1 = false;
  }
  else {
    if ((!NAN(t)) || (this->_has_value != true)) {
      if ((this->_ts)._dirty == true) {
        TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
        ::update(&this->_ts);
      }
      if ((this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar1 = TypedTimeSamples<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                ::
                get<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_nullptr>
                          (&this->_ts,v,t,tinerp);
        return bVar1;
      }
      if ((this->_has_value != true) || (this->_blocked != false)) goto LAB_00577ff3;
    }
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::operator=
              (v,&this->_value);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }